

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O0

void __thiscall FIX::FileLog::FileLog(FileLog *this,string *path)

{
  allocator<char> local_89;
  string local_88 [32];
  string local_68 [32];
  string local_48 [48];
  string *local_18;
  string *path_local;
  FileLog *this_local;
  
  local_18 = path;
  path_local = (string *)this;
  Log::Log(&this->super_Log);
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__FileLog_0032f9d0;
  std::ofstream::ofstream(&this->m_messages);
  std::ofstream::ofstream(&this->m_event);
  std::__cxx11::string::string((string *)&this->m_messagesFileName);
  std::__cxx11::string::string((string *)&this->m_eventFileName);
  std::__cxx11::string::string((string *)&this->m_fullPrefix);
  std::__cxx11::string::string((string *)&this->m_fullBackupPrefix);
  std::__cxx11::string::string(local_48,(string *)local_18);
  std::__cxx11::string::string(local_68,(string *)local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"GLOBAL",&local_89);
  init(this,(EVP_PKEY_CTX *)local_48);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

FileLog::FileLog(const std::string &path) { init(path, path, "GLOBAL"); }